

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O0

int it_xm_make_envelope(IT_ENVELOPE *envelope,unsigned_short *data,int y_offset)

{
  int iVar1;
  int val;
  int pos;
  int i;
  int y_offset_local;
  unsigned_short *data_local;
  IT_ENVELOPE *envelope_local;
  
  if (0xc < envelope->n_nodes) {
    envelope->n_nodes = '\f';
  }
  if (0xb < envelope->sus_loop_start) {
    envelope->flags = envelope->flags & 0xfb;
  }
  if (0xb < envelope->loop_end) {
    envelope->loop_end = '\0';
  }
  if (envelope->loop_end <= envelope->loop_start) {
    envelope->flags = envelope->flags & 0xfd;
  }
  pos = 0;
  for (i = 0; i < (int)(uint)envelope->n_nodes; i = i + 1) {
    iVar1 = pos + 1;
    envelope->node_t[i] = data[pos];
    pos = pos + 2;
    val = (int)data[iVar1];
    if (0x40 < (uint)val) {
      val = 0x40;
    }
    envelope->node_y[i] = (char)val + (char)y_offset;
  }
  return 0;
}

Assistant:

static int it_xm_make_envelope(IT_ENVELOPE *envelope, const unsigned short *data, int y_offset)
{
    int i, pos, val;

	if (envelope->n_nodes > 12) {
		/* XXX
		TRACE("XM error: wrong number of envelope nodes (%d)\n", envelope->n_nodes);
		envelope->n_nodes = 0;
		return -1; */
		envelope->n_nodes = 12;
	}

	if (envelope->sus_loop_start >= 12) envelope->flags &= ~IT_ENVELOPE_SUSTAIN_LOOP;
	if (envelope->loop_end >= 12) envelope->loop_end = 0;
	if (envelope->loop_start >= envelope->loop_end) envelope->flags &= ~IT_ENVELOPE_LOOP_ON;

	pos = 0;
	for (i = 0; i < envelope->n_nodes; i++) {
		envelope->node_t[i] = data[pos++];
        val = data[pos++];
        if (val > 64) {
            TRACE("XM error: out-of-range envelope node (node_y[%d]=%d)\n", i, val);
            /* FT2 seems to simply clip the value */
            val = 64;
		}
        envelope->node_y[i] = (signed char)(val + y_offset);
	}

	return 0;
}